

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

uint32_t idForLocale(char *locale,char *countryAndVariant,int capacity,UErrorCode *ec)

{
  int iVar1;
  int iVar2;
  char local_d8 [8];
  char variant [157];
  uint local_2c;
  uint32_t variantType;
  UErrorCode *ec_local;
  int capacity_local;
  char *countryAndVariant_local;
  char *locale_local;
  
  local_2c = 0;
  ulocimp_getRegionForSupplementalData_63(locale,'\0',countryAndVariant,capacity,ec);
  uloc_getVariant_63(locale,local_d8,0x9d,ec);
  if (local_d8[0] != '\0') {
    iVar1 = strcmp(local_d8,"EURO");
    iVar2 = strcmp(local_d8,"PREEURO");
    local_2c = (uint)(iVar1 == 0) | (uint)(iVar2 == 0) << 1;
    if (local_2c != 0) {
      strcat(countryAndVariant,"_");
      strcat(countryAndVariant,local_d8);
    }
  }
  return local_2c;
}

Assistant:

static uint32_t
idForLocale(const char* locale, char* countryAndVariant, int capacity, UErrorCode* ec)
{
    uint32_t variantType = 0;
    // !!! this is internal only, assumes buffer is not null and capacity is sufficient
    // Extract the country name and variant name.  We only
    // recognize two variant names, EURO and PREEURO.
    char variant[ULOC_FULLNAME_CAPACITY];
    ulocimp_getRegionForSupplementalData(locale, FALSE, countryAndVariant, capacity, ec);
    uloc_getVariant(locale, variant, sizeof(variant), ec);
    if (variant[0] != 0) {
        variantType = (uint32_t)(0 == uprv_strcmp(variant, VAR_EURO))
                   | ((uint32_t)(0 == uprv_strcmp(variant, VAR_PRE_EURO)) << 1);
        if (variantType)
        {
            uprv_strcat(countryAndVariant, VAR_DELIM_STR);
            uprv_strcat(countryAndVariant, variant);
        }
    }
    return variantType;
}